

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result wabt::TypeChecker::CheckType(Type actual,Type expected)

{
  Enum EVar1;
  Index IVar2;
  Index IVar3;
  Enum EVar4;
  Type local_1c;
  Type expected_local;
  Type actual_local;
  
  local_1c = expected;
  expected_local = actual;
  EVar1 = Type::operator_cast_to_Enum(&local_1c);
  if ((EVar1 == Any) || (EVar1 = Type::operator_cast_to_Enum(&expected_local), EVar1 == Any)) {
    Result::Result((Result *)&actual_local,Ok);
  }
  else {
    EVar1 = Type::operator_cast_to_Enum(&local_1c);
    if ((EVar1 == Reference) &&
       (EVar1 = Type::operator_cast_to_Enum(&expected_local), EVar1 == Reference)) {
      IVar2 = Type::GetReferenceIndex(&local_1c);
      IVar3 = Type::GetReferenceIndex(&expected_local);
      Result::Result((Result *)&actual_local,(uint)(IVar2 != IVar3));
    }
    else {
      EVar1 = Type::operator_cast_to_Enum(&expected_local);
      EVar4 = Type::operator_cast_to_Enum(&local_1c);
      if (EVar1 == EVar4) {
        Result::Result((Result *)&actual_local,Ok);
      }
      else {
        Result::Result((Result *)&actual_local,Error);
      }
    }
  }
  return (Result)actual_local.enum_;
}

Assistant:

Result TypeChecker::CheckType(Type actual, Type expected) {
  if (expected == Type::Any || actual == Type::Any) {
    return Result::Ok;
  }

  if (expected == Type::Reference && actual == Type::Reference) {
    return expected.GetReferenceIndex() == actual.GetReferenceIndex()
               ? Result::Ok
               : Result::Error;
  }
  if (actual != expected) {
    return Result::Error;
  }
  return Result::Ok;
}